

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

UniValue * JSONRPCExec(UniValue *__return_storage_ptr__,JSONRPCRequest *jreq,bool catch_errors)

{
  long lVar1;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  UniValue in_stack_fffffffffffffbf8;
  UniValue in_stack_fffffffffffffc50;
  _Optional_payload_base<UniValue> in_stack_fffffffffffffca8;
  UniValue local_d0;
  UniValue result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  result.val._M_dataplus._M_p = (pointer)&result.val.field_2;
  result.val._M_string_length = 0;
  result.val.field_2._M_local_buf[0] = '\0';
  result.typ = VNULL;
  result.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000011,catch_errors) == 0) {
    CRPCTable::execute(&local_d0,&tableRPC,jreq);
  }
  else {
    CRPCTable::execute(&local_d0,&tableRPC,jreq);
  }
  UniValue::operator=(&result,&local_d0);
  UniValue::~UniValue(&local_d0);
  UniValue::UniValue((UniValue *)&stack0xfffffffffffffcb8,&result);
  UniValue::UniValue((UniValue *)&stack0xfffffffffffffc60,&NullUniValue);
  std::_Optional_base<UniValue,_false,_false>::_Optional_base
            ((_Optional_base<UniValue,_false,_false> *)&stack0xfffffffffffffc00,
             (_Optional_base<UniValue,_false,_false> *)jreq);
  JSONRPCReplyObj(__return_storage_ptr__,in_stack_fffffffffffffbf8,in_stack_fffffffffffffc50,
                  (optional<UniValue>)in_stack_fffffffffffffca8,
                  (JSONRPCVersion)&stack0xfffffffffffffcb8);
  std::_Optional_payload_base<UniValue>::_M_reset
            ((_Optional_payload_base<UniValue> *)&stack0xfffffffffffffc00);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffc60);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffcb8);
  UniValue::~UniValue(&result);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue JSONRPCExec(const JSONRPCRequest& jreq, bool catch_errors)
{
    UniValue result;
    if (catch_errors) {
        try {
            result = tableRPC.execute(jreq);
        } catch (UniValue& e) {
            return JSONRPCReplyObj(NullUniValue, std::move(e), jreq.id, jreq.m_json_version);
        } catch (const std::exception& e) {
            return JSONRPCReplyObj(NullUniValue, JSONRPCError(RPC_MISC_ERROR, e.what()), jreq.id, jreq.m_json_version);
        }
    } else {
        result = tableRPC.execute(jreq);
    }

    return JSONRPCReplyObj(std::move(result), NullUniValue, jreq.id, jreq.m_json_version);
}